

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O0

AspifTextOutput * __thiscall
Potassco::AspifTextOutput::push(AspifTextOutput *this,WeightLitSpan *wlits)

{
  WeightLit_t *pWVar1;
  Span<Potassco::WeightLit_t> *in_RSI;
  AspifTextOutput *in_RDI;
  iterator end;
  iterator it;
  value_type_conflict1 *in_stack_ffffffffffffff98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffa0;
  Data *this_00;
  size_type in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  WeightLit_t *local_20;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&in_RDI->data_->directives);
  size<Potassco::WeightLit_t>(in_RSI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8
            );
  size<Potassco::WeightLit_t>(in_RSI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  local_20 = begin<Potassco::WeightLit_t>(in_RSI);
  pWVar1 = end<Potassco::WeightLit_t>((Span<Potassco::WeightLit_t> *)0x110892);
  for (; local_20 != pWVar1; local_20 = local_20 + 1) {
    this_00 = in_RDI->data_;
    lit(local_20);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this_00->directives,in_stack_ffffffffffffff98);
    weight(local_20);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this_00->directives,in_stack_ffffffffffffff98);
  }
  return in_RDI;
}

Assistant:

AspifTextOutput& AspifTextOutput::push(const WeightLitSpan& wlits) {
	data_->directives.reserve(data_->directives.size() + (2*size(wlits)));
	data_->directives.push_back(static_cast<uint32_t>(size(wlits)));
	for (WeightLitSpan::iterator it = begin(wlits), end = Potassco::end(wlits); it != end; ++it) {
		data_->directives.push_back(static_cast<uint32_t>(lit(*it)));
		data_->directives.push_back(static_cast<uint32_t>(weight(*it)));
	}
	return *this;
}